

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

int __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,int,duckdb::QuantileIndirect<int>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<int> *accessor)

{
  RESULT_TYPE_conflict1 RVar1;
  int iVar2;
  int iVar3;
  unsigned_long local_38;
  unsigned_long local_30;
  
  local_38 = hidx;
  local_30 = lidx;
  RVar1 = QuantileIndirect<int>::operator()(accessor,&local_30);
  iVar2 = Cast::Operation<int,int>(RVar1);
  if (lidx != hidx) {
    RVar1 = QuantileIndirect<int>::operator()(accessor,&local_38);
    iVar3 = Cast::Operation<int,int>(RVar1);
    iVar2 = (int)((double)(iVar3 - iVar2) *
                  (this->RN -
                  (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25)
                  + ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                 (double)iVar2);
  }
  return iVar2;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}